

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O3

bool mkvmuxer::WriteEbmlElement(IMkvWriter *writer,uint64 type,float value)

{
  bool bVar1;
  float fVar2;
  undefined4 in_EAX;
  int32 iVar3;
  int iVar4;
  int iVar5;
  int32 bit_count;
  bool bVar6;
  uint8 byte;
  uint8 b;
  undefined4 uStack_28;
  float local_24;
  
  if (writer == (IMkvWriter *)0x0) {
    return false;
  }
  _uStack_28 = CONCAT44(value,in_EAX);
  iVar3 = WriteID(writer,type);
  if (iVar3 == 0) {
    uStack_28 = CONCAT13(0x84,(undefined3)uStack_28);
    iVar4 = (**writer->_vptr_IMkvWriter)(writer,(long)&uStack_28 + 3,1);
    if (-1 < iVar4) {
      fVar2 = local_24;
      iVar4 = 0x18;
      do {
        uStack_28._0_3_ =
             CONCAT12((char)((uint)fVar2 >> ((byte)iVar4 & 0x1f)),(undefined2)uStack_28);
        iVar5 = (**writer->_vptr_IMkvWriter)(writer,(long)&uStack_28 + 2,1);
        bVar1 = iVar5 >= 0;
        if (iVar5 < 0) {
          return bVar1;
        }
        bVar6 = iVar4 != 0;
        iVar4 = iVar4 + -8;
      } while (bVar6);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool WriteEbmlElement(IMkvWriter* writer, uint64 type, float value) {
  if (!writer)
    return false;

  if (WriteID(writer, type))
    return false;

  if (WriteUInt(writer, 4))
    return false;

  if (SerializeFloat(writer, value))
    return false;

  return true;
}